

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  cmGeneratorTarget *target;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  string *psVar6;
  reference ppcVar7;
  cmGlobalGenerator *pcVar8;
  cmake *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference config;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar10;
  string *c;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  undefined1 local_510 [7];
  bool newCMP0022Behavior;
  undefined1 local_500 [8];
  string errorMessage;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  undefined1 local_350 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *gte;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  undefined1 local_2e0 [16];
  string local_2d0;
  undefined1 local_2b0 [8];
  ostringstream e;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmGeneratorTarget *local_b8;
  cmGeneratorTarget *te;
  string *tei;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_78 [7];
  bool generatedInterfaceRequired;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  string sep;
  string expectedTargets;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  bVar2 = false;
  GetTargets(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78);
  tei = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&tei), bVar1) {
    te = (cmGeneratorTarget *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    local_b8 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)te);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_118,local_b8);
    std::operator+(&local_d8,&local_f8,&local_118);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::operator=
              ((string *)
               &targets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
    pVar10 = std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&local_b8);
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
      poVar5 = std::operator<<((ostream *)local_2b0,"given target \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(local_b8);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::operator<<(poVar5,"\" more than once.");
      pcVar8 = cmLocalGenerator::GetGlobalGenerator(this->LG);
      pcVar9 = cmGlobalGenerator::GetCMakeInstance(pcVar8);
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::GetMakefile(this->LG);
      cmMakefile::GetBacktrace((cmMakefile *)local_2e0);
      cmake::IssueMessage(pcVar9,FATAL_ERROR,(string *)(local_2e0 + 0x10),
                          (cmListFileBacktrace *)local_2e0);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2e0);
      std::__cxx11::string::~string((string *)(local_2e0 + 0x10));
      this_local._7_1_ = 0;
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
      goto LAB_00415033;
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
              (&this->Exports,&local_b8);
    TVar3 = GetExportTargetType(this,local_b8);
    bVar2 = bVar2 || TVar3 == INTERFACE_LIBRARY;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if (bVar2) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.0.0");
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
            (this,os,(undefined1 *)((long)&sep.field_2 + 8));
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_00415033:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::__cxx11::string::~string
            ((string *)
             &targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  if (missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_1);
    __end1_1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                         (&this->Exports);
    gte = (cmGeneratorTarget *)
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                    (&this->Exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                               *)&gte), bVar2) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end1_1);
      target = *ppcVar7;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
      TVar3 = GetExportTargetType(this,target);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target,(ulong)TVar3);
      cmTarget::AppendBuildInterfaceIncludes
                (*(cmTarget **)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"INTERFACE_INCLUDE_DIRECTORIES",&local_371);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_370,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"INTERFACE_SOURCES",&local_399);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_398,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"INTERFACE_COMPILE_DEFINITIONS",&local_3c1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3c0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"INTERFACE_COMPILE_OPTIONS",&local_3e9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3e8,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"INTERFACE_AUTOUIC_OPTIONS",&local_411);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_410,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"INTERFACE_COMPILE_FEATURES",&local_439);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_438,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator(&local_439);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"INTERFACE_LINK_OPTIONS",&local_461);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_460,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator(&local_461);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"INTERFACE_LINK_DIRECTORIES",&local_489);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_488,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"INTERFACE_LINK_DEPENDS",&local_4b1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4b0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d8,"INTERFACE_POSITION_INDEPENDENT_CODE",
                 (allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf));
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4d8,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ImportPropertyMap *)local_350);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::string((string *)local_500);
      bVar2 = cmExportFileGenerator::PopulateExportProperties
                        (&this->super_cmExportFileGenerator,
                         (cmGeneratorTarget *)
                         properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ImportPropertyMap *)local_350,(string *)local_500);
      if (bVar2) {
        PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022
                          ((cmGeneratorTarget *)
                           properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar2 = false;
        if (PVar4 != WARN) {
          PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar2 = PVar4 != OLD;
        }
        if (bVar2) {
          cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_350,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_350);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                  (this,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,local_350);
        missingTargets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        pcVar8 = cmLocalGenerator::GetGlobalGenerator(this->LG);
        pcVar9 = cmGlobalGenerator::GetCMakeInstance(pcVar8);
        cmLocalGenerator::GetMakefile(this->LG);
        cmMakefile::GetBacktrace((cmMakefile *)local_510);
        cmake::IssueMessage(pcVar9,FATAL_ERROR,(string *)local_500,(cmListFileBacktrace *)local_510)
        ;
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_510);
        this_local._7_1_ = 0;
        missingTargets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_500);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_350);
      if (missingTargets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00415b7e;
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end1_1);
    }
    this_00 = &(this->super_cmExportFileGenerator).Configurations;
    __end1_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
    c = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&c), bVar2) {
      config = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_2);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,os,config,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_2);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os,&__range1_1);
    this_local._7_1_ = 1;
    missingTargets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_00415b7e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1_1);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}